

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbndmat.cpp
# Opt level: O2

void __thiscall TPZFBMatrix<double>::Transpose(TPZFBMatrix<double> *this,TPZMatrix<double> *T)

{
  long lVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar4;
  long lVar5;
  int64_t c;
  long lVar6;
  undefined1 local_38 [8];
  
  iVar2 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  iVar3 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])
            (T,CONCAT44(extraout_var,iVar2),CONCAT44(extraout_var_00,iVar3));
  lVar1 = 0;
  while (lVar5 = lVar1,
        iVar2 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0xc])(this), lVar5 < CONCAT44(extraout_var_01,iVar2)) {
    lVar6 = lVar5 - this->fBandLower;
    if (lVar6 < 1) {
      lVar6 = 0;
    }
    lVar1 = lVar5 + 1;
    lVar4 = this->fBandUpper;
    iVar2 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0xc])(this);
    if (lVar4 + lVar1 < CONCAT44(extraout_var_02,iVar2)) {
      lVar4 = this->fBandUpper + lVar1;
    }
    else {
      iVar2 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0xc])(this);
      lVar4 = CONCAT44(extraout_var_03,iVar2);
    }
    for (; lVar6 < lVar4; lVar6 = lVar6 + 1) {
      (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24])
                (this,lVar5,lVar6);
      (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(T,lVar6,lVar5,local_38);
    }
  }
  return;
}

Assistant:

void
TPZFBMatrix<TVar>::Transpose (TPZMatrix<TVar> *const T) const
{
	T->Resize( Dim(), Dim() );
	
	int64_t end, begin;
	//REAL *p = fElem;
	for ( int64_t r = 0; r < Dim(); r++ )
    {
		begin = MAX( r - fBandLower, 0 );
		end   = MIN( r + fBandUpper + 1, Dim() );
		for ( int64_t c = begin; c < end; c++ )
		{
			T->PutVal( c, r, GetVal( r, c ) );
			//			cout<<"(r,c)= "<<r<<"  "<<c<<"\n";
		}
    }
}